

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int i2c_ASN1_BIT_STRING(ASN1_BIT_STRING *a,uchar **pp)

{
  int iVar1;
  byte *dst;
  uint8_t *p;
  int ret;
  int len;
  uint8_t bits;
  uchar **pp_local;
  ASN1_BIT_STRING *a_local;
  
  if (a == (ASN1_BIT_STRING *)0x0) {
    a_local._4_4_ = 0;
  }
  else {
    _len = pp;
    pp_local = (uchar **)a;
    iVar1 = asn1_bit_string_length((ASN1_BIT_STRING *)a,(uint8_t *)((long)&ret + 3));
    if (iVar1 < 0x7fffffff) {
      a_local._4_4_ = iVar1 + 1;
      if (_len != (uchar **)0x0) {
        dst = *_len + 1;
        **_len = ret._3_1_;
        OPENSSL_memcpy(dst,pp_local[1],(long)iVar1);
        if (0 < iVar1) {
          dst[iVar1 + -1] = dst[iVar1 + -1] & (byte)(0xff << (ret._3_1_ & 0x1f));
        }
        *_len = dst + iVar1;
      }
    }
    else {
      ERR_put_error(0xc,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                    ,0x4f);
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

int i2c_ASN1_BIT_STRING(const ASN1_BIT_STRING *a, unsigned char **pp) {
  if (a == NULL) {
    return 0;
  }

  uint8_t bits;
  int len = asn1_bit_string_length(a, &bits);
  if (len > INT_MAX - 1) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int ret = 1 + len;
  if (pp == NULL) {
    return ret;
  }

  uint8_t *p = *pp;
  *(p++) = bits;
  OPENSSL_memcpy(p, a->data, len);
  if (len > 0) {
    p[len - 1] &= (0xff << bits);
  }
  p += len;
  *pp = p;
  return ret;
}